

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::set_type(MutObjective *this,Type type)

{
  ulong *puVar1;
  ulong uVar2;
  reference rVar3;
  
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (&((this->
                       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                      problem_)->is_obj_max_,
                     (long)(this->
                           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                           .index_);
  puVar1 = rVar3._M_p;
  if (type == MAX) {
    uVar2 = rVar3._M_mask | *puVar1;
  }
  else {
    uVar2 = ~rVar3._M_mask & *puVar1;
  }
  *puVar1 = uVar2;
  return;
}

Assistant:

void set_type(obj::Type type) const {
      this->problem_->is_obj_max_[this->index_] = (type == obj::MAX);
    }